

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPOMDPPlanner.cpp
# Opt level: O1

QFunctionsDiscrete * __thiscall
MonahanPOMDPPlanner::BackupStage
          (QFunctionsDiscrete *__return_storage_ptr__,MonahanPOMDPPlanner *this,
          QFunctionsDiscrete *Q,size_t maxNrAlphas)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  PlanningUnitDecPOMDPDiscrete *pPVar5;
  size_t sVar6;
  long lVar7;
  size_type sVar8;
  long lVar9;
  QFunctionsDiscrete *Q1;
  GaoVectorSet G;
  ValueFunctionPOMDPDiscrete local_c8;
  GaoVectorSet local_b0;
  
  pPVar5 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
  if (pPVar5 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar5 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
  }
  iVar4 = (**(code **)((long)*(pPVar5->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(__return_storage_ptr__,(long)iVar4,(allocator_type *)&local_b0);
  AlphaVectorPlanning::QFunctionsToValueFunction(&local_c8,Q);
  AlphaVectorPlanning::BackProject(&local_b0,(AlphaVectorPlanning *)this,&local_c8);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"MonahanPOMDPPlanner::BackupStage <",0x22);
  std::ostream::flush();
  if (iVar4 != 0) {
    lVar7 = 8;
    sVar8 = 0;
    lVar9 = 0;
    do {
      MonahanCrossSum(this,&local_b0,__return_storage_ptr__,(Index)sVar8,
                      (this->super_MonahanPlanner)._m_doIncPrune,maxNrAlphas);
      pvVar1 = (__return_storage_ptr__->
               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)((long)&(pvVar1->
                               super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>).
                               _M_impl.super__Vector_impl_data + lVar7);
      lVar3 = *(long *)((long)pvVar1 + lVar7 + -8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ostream::flush();
      sVar6 = MonahanPlanner::GetNrVectors(&this->super_MonahanPlanner);
      lVar9 = lVar9 + (lVar2 - lVar3 >> 3) * -0x3333333333333333;
      MonahanPlanner::CheckMaxNrVectors(&this->super_MonahanPlanner,maxNrAlphas,sVar6 + lVar9);
      sVar8 = sVar8 + 1;
      lVar7 = lVar7 + 0x18;
    } while ((long)iVar4 != sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  if (local_b0.base_ !=
      (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
       **)0x0) {
    operator_delete(local_b0.base_,local_b0.allocated_elements_ << 3);
  }
  return __return_storage_ptr__;
}

Assistant:

QFunctionsDiscrete 
MonahanPOMDPPlanner::BackupStage(const QFunctionsDiscrete &Q,
                                 size_t maxNrAlphas)
{
    int nrA=GetPU()->GetNrJointActions();
    QFunctionsDiscrete Q1(nrA);

    GaoVectorSet G=BackProject(QFunctionsToValueFunction(Q));

    size_t nrVectorsComputed=0;

    // Do the cross-sums, results are stored in V1
    cout << "MonahanPOMDPPlanner::BackupStage <"; cout.flush();
    for(GaoVectorSetIndex a=0;a!=nrA;a++)
    {
        MonahanCrossSum(G,Q1,a,_m_doIncPrune,maxNrAlphas);
        nrVectorsComputed+=Q1[a].size();
        cout << " " << Q1[a].size(); cout.flush();
        CheckMaxNrVectors(maxNrAlphas,GetNrVectors()+nrVectorsComputed);
    }
    cout << ">" << endl;
    return(Q1);
}